

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

int dictionary_set(dictionary *d,char *key,char *val)

{
  size_t __nmemb;
  char **__src;
  uint uVar1;
  int iVar2;
  char **__ptr;
  char **__ptr_00;
  uint *__ptr_01;
  char *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  iVar2 = -1;
  if (key != (char *)0x0 && d != (dictionary *)0x0) {
    uVar1 = dictionary_hash(key);
    lVar4 = (long)d->n;
    lVar5 = d->size;
    if (0 < lVar4) {
      lVar6 = 0;
      lVar7 = 0;
      if (0 < lVar5) {
        lVar7 = lVar5;
      }
      for (; lVar7 != lVar6; lVar6 = lVar6 + 1) {
        if (((d->key[lVar6] != (char *)0x0) && (uVar1 == d->hash[lVar6])) &&
           (iVar2 = strcmp(key,d->key[lVar6]), iVar2 == 0)) {
          free(d->val[lVar6]);
          if (val == (char *)0x0) {
            pcVar3 = (char *)0x0;
          }
          else {
            pcVar3 = xstrdup(val);
          }
          d->val[lVar6] = pcVar3;
          return 0;
        }
      }
    }
    if (lVar5 == lVar4) {
      __nmemb = lVar5 * 2;
      __ptr = (char **)calloc(__nmemb,8);
      __ptr_00 = (char **)calloc(__nmemb,8);
      __ptr_01 = (uint *)calloc(__nmemb,4);
      if (__ptr_01 == (uint *)0x0 || (__ptr_00 == (char **)0x0 || __ptr == (char **)0x0)) {
        free(__ptr);
        free(__ptr_00);
        free(__ptr_01);
        return -1;
      }
      __src = d->val;
      memcpy(__ptr,__src,lVar5 * 8);
      memcpy(__ptr_00,d->key,lVar5 * 8);
      memcpy(__ptr_01,d->hash,lVar5 << 2);
      free(__src);
      free(d->key);
      free(d->hash);
      lVar5 = d->size * 2;
      d->size = lVar5;
      d->val = __ptr;
      d->key = __ptr_00;
      d->hash = __ptr_01;
      lVar4 = (long)d->n;
    }
    else {
      __ptr_00 = d->key;
    }
    while (__ptr_00[lVar4] != (char *)0x0) {
      lVar4 = lVar4 + 1;
      if (lVar4 == lVar5) {
        lVar4 = 0;
      }
    }
    pcVar3 = xstrdup(key);
    d->key[lVar4] = pcVar3;
    iVar2 = 0;
    if (val == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = xstrdup(val);
    }
    d->val[lVar4] = pcVar3;
    d->hash[lVar4] = uVar1;
    d->n = d->n + 1;
  }
  return iVar2;
}

Assistant:

int dictionary_set(dictionary * d, const char * key, const char * val)
{
    ssize_t         i ;
    unsigned       hash ;

    if (d == NULL || key == NULL) return -1 ;

    /* Compute hash for this key */
    hash = dictionary_hash(key) ;
    /* Find if value is already in dictionary */
    if (d->n > 0) {
        for (i = 0 ; i < d->size ; i++) {
            if (d->key[i] == NULL)
                continue ;
            if (hash == d->hash[i]) { /* Same hash value */
                if (!strcmp(key, d->key[i])) {   /* Same key */
                    /* Found a value: modify and return */
                    if (d->val[i] != NULL)
                        free(d->val[i]);
                    d->val[i] = (val ? xstrdup(val) : NULL);
                    /* Value has been modified: return */
                    return 0 ;
                }
            }
        }
    }
    /* Add a new value */
    /* See if dictionary needs to grow */
    if (d->n == d->size) {
        /* Reached maximum size: reallocate dictionary */
        if (dictionary_grow(d) != 0)
            return -1;
    }

    /* Insert key in the first empty slot. Start at d->n and wrap at
       d->size. Because d->n < d->size this will necessarily
       terminate. */
    for (i = d->n ; d->key[i] ; ) {
        if (++i == d->size) i = 0;
    }
    /* Copy key */
    d->key[i]  = xstrdup(key);
    d->val[i]  = (val ? xstrdup(val) : NULL) ;
    d->hash[i] = hash;
    d->n ++ ;
    return 0 ;
}